

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

void __thiscall
phmap::priv::
btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
::remove_value(btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
               *this,int i,allocator_type *alloc)

{
  int iVar1;
  bool bVar2;
  byte bVar3;
  field_type fVar4;
  template_ElementType<3UL> *ppbVar5;
  ulong i_00;
  
  bVar2 = leaf(this);
  if (!bVar2) {
    bVar3 = count(this);
    iVar1 = i + 1;
    if (iVar1 < (int)(uint)bVar3) {
      ppbVar5 = btree_node<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
                ::GetField<3ul>((btree_node<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
                                 *)this);
      fVar4 = count(ppbVar5[iVar1]);
      i_00 = (long)iVar1;
      if (fVar4 != '\0') {
        __assert_fail("child(i + 1)->count() == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0x869,
                      "void phmap::priv::btree_node<phmap::priv::set_params<std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>>::remove_value(const int, allocator_type *) [Params = phmap::priv::set_params<std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>]"
                     );
      }
      while( true ) {
        bVar3 = count(this);
        if (bVar3 <= i_00) break;
        ppbVar5 = btree_node<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
                  ::GetField<3ul>((btree_node<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
                                   *)this);
        set_child(this,i_00,ppbVar5[i_00 + 1]);
        i_00 = i_00 + 1;
      }
      count(this);
      btree_node<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
      ::GetField<3ul>((btree_node<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
                       *)this);
    }
  }
  remove_values_ignore_children(this,i,1,alloc);
  return;
}

Assistant:

inline void btree_node<P>::remove_value(const int i, allocator_type *alloc) {
        if (!leaf() && count() > i + 1) {
            assert(child(i + 1)->count() == 0);
            for (size_type j = i + 1; j < count(); ++j) {
                set_child(j, child(j + 1));
            }
            clear_child(count());
        }

        remove_values_ignore_children(i, /*to_erase=*/1, alloc);
    }